

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O0

Var __thiscall
Js::JavascriptGenerator::CallGenerator
          (JavascriptGenerator *this,Var data,ResumeYieldKind resumeKind)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  InterpreterStackFrame **ppIVar6;
  ScriptFunction *pSVar7;
  FunctionBody *pFVar8;
  InterpreterStackFrame *this_02;
  InterpreterStackFrame *this_03;
  Var aValue;
  ThreadContext *threadContext;
  ScriptFunction **ppSVar9;
  ScriptFunction *this_04;
  JavascriptMethod entryPoint;
  RecyclableObject *value;
  JavascriptBoolean *done;
  JavascriptException *err;
  undefined1 local_98 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  GeneratorStateHelper helper;
  Arguments arguments;
  Var thunkArgs [2];
  uint32 local_48;
  RegSlot reg;
  uint32 i;
  uint32 innerScopeCount;
  Var result;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ResumeYieldKind resumeKind_local;
  Var data_local;
  JavascriptGenerator *this_local;
  
  bVar2 = IsExecuting(this);
  if ((bVar2) || (bVar2 = IsCompleted(this), bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptGenerator.cpp"
                                ,0xa9,"(!IsExecuting() && !IsCompleted())",
                                "!IsExecuting() && !IsCompleted()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  this_01 = ScriptContext::GetLibrary(this_00);
  ppIVar6 = Memory::WriteBarrierPtr::operator_cast_to_InterpreterStackFrame__
                      ((WriteBarrierPtr *)&this->frame);
  if (*ppIVar6 != (InterpreterStackFrame *)0x0) {
    pSVar7 = Memory::WriteBarrierPtr<Js::ScriptFunction>::operator->(&this->scriptFunction);
    pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar7);
    uVar3 = FunctionBody::GetInnerScopeCount(pFVar8);
    for (local_48 = 0; local_48 < uVar3; local_48 = local_48 + 1) {
      pSVar7 = Memory::WriteBarrierPtr<Js::ScriptFunction>::operator->(&this->scriptFunction);
      pFVar8 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar7);
      RVar4 = FunctionBody::GetFirstInnerScopeRegister(pFVar8);
      this_02 = Memory::WriteBarrierPtr<Js::InterpreterStackFrame>::operator->(&this->frame);
      this_03 = Memory::WriteBarrierPtr<Js::InterpreterStackFrame>::operator->(&this->frame);
      aValue = InterpreterStackFrame::InnerScopeFromIndex(this_03,local_48);
      InterpreterStackFrame::SetNonVarReg(this_02,RVar4 + local_48,aValue);
    }
  }
  SetResumeYieldProperties(this,data,resumeKind);
  arguments.Values = (Type)this;
  Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
            ((WriteBarrierPtr *)&this->resumeYieldObject);
  Arguments::Arguments((Arguments *)&helper.didThrow,2,&arguments.Values);
  anon_unknown.dwarf_4e5a3fa::GeneratorStateHelper::GeneratorStateHelper
            ((GeneratorStateHelper *)&autoReentrancyHandler.m_savedReentrancySafeOrHandled,this);
  threadContext = ScriptContext::GetThreadContext(this_00);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_98,threadContext);
  ppSVar9 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunction__
                      ((WriteBarrierPtr *)&this->scriptFunction);
  pSVar7 = *ppSVar9;
  this_04 = Memory::WriteBarrierPtr<Js::ScriptFunction>::operator->(&this->scriptFunction);
  entryPoint = RecyclableObject::GetEntryPoint((RecyclableObject *)this_04);
  Arguments::Arguments((Arguments *)&err,(Arguments *)&helper.didThrow);
  this_local = (JavascriptGenerator *)
               JavascriptFunction::CallFunction<true>
                         ((RecyclableObject *)pSVar7,entryPoint,(Arguments *)&err,false);
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_98);
  helper.generator._0_1_ = 0;
  anon_unknown.dwarf_4e5a3fa::GeneratorStateHelper::~GeneratorStateHelper
            ((GeneratorStateHelper *)&autoReentrancyHandler.m_savedReentrancySafeOrHandled);
  value = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  SetResumeYieldProperties(this,value,Normal);
  bVar2 = IsCompleted(this);
  if (bVar2) {
    done = JavascriptLibraryBase::GetTrue(&this_01->super_JavascriptLibraryBase);
    this_local = (JavascriptGenerator *)
                 JavascriptLibrary::CreateIteratorResultObject(this_01,this_local,done);
  }
  return this_local;
}

Assistant:

Var JavascriptGenerator::CallGenerator(Var data, ResumeYieldKind resumeKind)
{
    Assert(!IsExecuting() && !IsCompleted());

    ScriptContext* scriptContext = this->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();
    Var result = nullptr;

    if (this->frame)
    {
        // if the function already has a state it may be going to resume in the jit
        // if so copy any innerScopes into registers jit can access
        uint32 innerScopeCount = this->scriptFunction->GetFunctionBody()->GetInnerScopeCount();
        for (uint32 i = 0; i < innerScopeCount; ++i)
        {
            Js::RegSlot reg = this->scriptFunction->GetFunctionBody()->GetFirstInnerScopeRegister() + i;
            this->frame->SetNonVarReg(reg, this->frame->InnerScopeFromIndex(i));
        }
    }

    SetResumeYieldProperties(data, resumeKind);

    {
        Var thunkArgs[] = {this, this->resumeYieldObject};
        Arguments arguments(_countof(thunkArgs), thunkArgs);
        GeneratorStateHelper helper(this);

        try
        {
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                result = JavascriptFunction::CallFunction<1>(
                    this->scriptFunction,
                    this->scriptFunction->GetEntryPoint(),
                    arguments);
            }
            END_SAFE_REENTRANT_CALL
            helper.didThrow = false;
        }
        catch (const JavascriptException& err)
        {
            JavascriptExceptionOperators::DoThrowCheckClone(err.GetAndClear(), scriptContext);
        }
    }

    // Clear the value property of the resume yield object so that we don't
    // extend the lifetime of the value
    SetResumeYieldProperties(library->GetUndefined(), ResumeYieldKind::Normal);

    if (IsCompleted())
        return library->CreateIteratorResultObject(result, library->GetTrue());

    return result;
}